

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int priv_encode_gost(PKCS8_PRIV_KEY_INFO *p8,EVP_PKEY *pk)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  ASN1_OBJECT *aobj;
  char *__s1;
  uchar *penc;
  ASN1_STRING *a;
  ASN1_STRING *str;
  undefined8 in_RSI;
  PKCS8_PRIV_KEY_INFO *in_RDI;
  uchar *priv_buf;
  int priv_len;
  ASN1_STRING *octet;
  uchar tmp;
  char *pk_format;
  int i;
  int key_len;
  uchar *buf;
  ASN1_STRING *params;
  ASN1_OBJECT *algobj;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uchar *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uchar *local_60;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_38;
  
  iVar2 = EVP_PKEY_get_base_id(in_RSI);
  aobj = OBJ_nid2obj(iVar2);
  iVar2 = pkey_bits_gost((EVP_PKEY *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  __s1 = get_gost_engine_param(in_stack_ffffffffffffff8c);
  if (iVar2 < 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = iVar2 / 8;
  }
  if ((iVar2 == 0) ||
     (iVar3 = iVar2,
     penc = (uchar *)CRYPTO_secure_malloc
                               ((long)iVar2,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                                ,0x2a8), penc == (uchar *)0x0)) {
    return 0;
  }
  gost_get0_priv_key((EVP_PKEY *)CONCAT44(iVar3,in_stack_ffffffffffffff98));
  iVar3 = store_bignum((BIGNUM *)CONCAT44(iVar3,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90
                       ,in_stack_ffffffffffffff8c);
  if (iVar3 == 0) {
    CRYPTO_secure_free(penc,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                       ,0x2ad);
    return 0;
  }
  a = encode_gost_algor_params
                ((EVP_PKEY *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (a == (ASN1_STRING *)0x0) {
    CRYPTO_secure_free(penc,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                       ,0x2b3);
    return 0;
  }
  for (local_38 = 0; local_38 < iVar2 / 2; local_38 = local_38 + 1) {
    uVar1 = penc[local_38];
    penc[local_38] = penc[(iVar2 + -1) - local_38];
    penc[(iVar2 + -1) - local_38] = uVar1;
  }
  if ((__s1 != (char *)0x0) && (iVar3 = strcmp(__s1,"LEGACY_PK_WRAP"), iVar3 == 0)) {
    str = ASN1_STRING_new();
    local_60 = (uchar *)0x0;
    if ((str != (ASN1_STRING *)0x0) && (iVar2 = ASN1_OCTET_STRING_set(str,penc,iVar2), iVar2 != 0))
    {
      iVar2 = i2d_ASN1_OCTET_STRING(str,&local_60);
      ASN1_STRING_free(str);
      CRYPTO_secure_free(penc,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                         ,0x2ca);
      iVar2 = PKCS8_pkey_set0(in_RDI,aobj,0,0x10,a,local_60,iVar2);
      return iVar2;
    }
    ASN1_STRING_free(str);
    ASN1_STRING_free((ASN1_STRING *)a);
    CRYPTO_secure_free(penc,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                       ,0x2c5);
    return 0;
  }
  iVar2 = PKCS8_pkey_set0(in_RDI,aobj,0,0x10,a,penc,iVar2);
  return iVar2;
}

Assistant:

static int priv_encode_gost(PKCS8_PRIV_KEY_INFO *p8, const EVP_PKEY *pk)
{
    ASN1_OBJECT *algobj = OBJ_nid2obj(EVP_PKEY_base_id(pk));
    ASN1_STRING *params = NULL;
    unsigned char *buf = NULL;
    int key_len = pkey_bits_gost(pk), i = 0;
    /* unmasked private key */
    const char *pk_format = get_gost_engine_param(GOST_PARAM_PK_FORMAT);

    key_len = (key_len < 0) ? 0 : key_len / 8;
    if (key_len == 0 || !(buf = OPENSSL_secure_malloc(key_len))) {
        return 0;
    }

    if (!store_bignum(gost_get0_priv_key(pk), buf, key_len)) {
        OPENSSL_secure_free(buf);
        return 0;
    }

    params = encode_gost_algor_params(pk);
    if (!params) {
        OPENSSL_secure_free(buf);
        return 0;
    }

    /* Convert buf to Little-endian */
    for (i = 0; i < key_len / 2; i++) {
        unsigned char tmp = buf[i];
        buf[i] = buf[key_len - 1 - i];
        buf[key_len - 1 - i] = tmp;
    }

    if (pk_format != NULL && strcmp(pk_format, PK_WRAP_PARAM) == 0) {
        ASN1_STRING *octet = ASN1_STRING_new();
        int priv_len = 0;
        unsigned char *priv_buf = NULL;
        if (!octet || !ASN1_OCTET_STRING_set(octet, buf, key_len)) {
            ASN1_STRING_free(octet);
            ASN1_STRING_free(params);
            OPENSSL_secure_free(buf);
            return 0;
        }
        priv_len = i2d_ASN1_OCTET_STRING(octet, &priv_buf);
        ASN1_STRING_free(octet);
        OPENSSL_secure_free(buf);

        return PKCS8_pkey_set0(p8, algobj, 0, V_ASN1_SEQUENCE, params,
                               priv_buf, priv_len);
    }

    return PKCS8_pkey_set0(p8, algobj, 0, V_ASN1_SEQUENCE, params,
                           buf, key_len);
}